

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void dbgbcr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  byte bVar1;
  ArchCPU_conflict2 *cpu_00;
  uint64_t uVar2;
  uint64_t fieldval;
  int i;
  ARMCPU_conflict1 *cpu;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  cpu_00 = env_archcpu(env);
  bVar1 = ri->crm;
  uVar2 = extract64(value,5,1);
  uVar2 = deposit64(value,6,1,uVar2);
  fieldval = extract64(uVar2,7,1);
  uVar2 = deposit64(uVar2,8,1,fieldval);
  raw_write(env,ri,uVar2);
  hw_breakpoint_update_aarch64(cpu_00,(uint)bVar1);
  return;
}

Assistant:

static void dbgbcr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                         uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    int i = ri->crm;

    /* BAS[3] is a read-only copy of BAS[2], and BAS[1] a read-only
     * copy of BAS[0].
     */
    value = deposit64(value, 6, 1, extract64(value, 5, 1));
    value = deposit64(value, 8, 1, extract64(value, 7, 1));

    raw_write(env, ri, value);
    hw_breakpoint_update(cpu, i);
}